

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_NtkSetNodeLevelsArrival(Abc_Ntk_t *pNtkOld)

{
  float fVar1;
  long *plVar2;
  float *pfVar3;
  void *pvVar4;
  Mio_Library_t *pMVar5;
  Mio_Gate_t *pMVar6;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  float fVar9;
  float fVar10;
  
  if ((pNtkOld->pManTime != (Abc_ManTime_t *)0x0) &&
     (pvVar4 = Abc_FrameReadLibGen(), pvVar4 != (void *)0x0)) {
    pMVar5 = (Mio_Library_t *)Abc_FrameReadLibGen();
    pMVar6 = Mio_LibraryReadNand2(pMVar5);
    if (pMVar6 != (Mio_Gate_t *)0x0) {
      pMVar5 = (Mio_Library_t *)Abc_FrameReadLibGen();
      fVar9 = Mio_LibraryReadDelayNand2Max(pMVar5);
      pVVar8 = pNtkOld->vCis;
      if (0 < pVVar8->nSize) {
        lVar7 = 0;
        do {
          plVar2 = (long *)pVVar8->pArray[lVar7];
          pfVar3 = *(float **)
                    (*(long *)(*(long *)(*(long *)(*plVar2 + 0x108) + 0x10) + 8) +
                    (long)(int)plVar2[2] * 8);
          fVar10 = *pfVar3;
          fVar1 = pfVar3[1];
          if (fVar10 <= fVar1) {
            fVar10 = fVar1;
          }
          *(uint *)(plVar2[8] + 0x14) =
               *(uint *)(plVar2[8] + 0x14) & 0xfff | (int)(fVar10 / fVar9) << 0xc;
          lVar7 = lVar7 + 1;
          pVVar8 = pNtkOld->vCis;
        } while (lVar7 < pVVar8->nSize);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkSetNodeLevelsArrival( Abc_Ntk_t * pNtkOld )
{
    Abc_Obj_t * pNodeOld, * pNodeNew;
    float tAndDelay;
    int i;
    if ( pNtkOld->pManTime == NULL )
        return;
    if ( Abc_FrameReadLibGen() == NULL || Mio_LibraryReadNand2((Mio_Library_t *)Abc_FrameReadLibGen()) == NULL )
        return;
    tAndDelay = Mio_LibraryReadDelayNand2Max((Mio_Library_t *)Abc_FrameReadLibGen());
    Abc_NtkForEachCi( pNtkOld, pNodeOld, i )
    {
        pNodeNew = pNodeOld->pCopy;
        pNodeNew->Level = (int)(Abc_NodeReadArrivalWorst(pNodeOld) / tAndDelay);
    }
}